

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O0

void collectDependencies(string *filename,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *lines)

{
  bool bVar1;
  char __lhs;
  long lVar2;
  ostream *poVar3;
  reference pbVar4;
  value_type *in_RSI;
  string *in_RDI;
  size_t found;
  anon_class_8_1_898e5cf2 *is_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool searching;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  raw_lines;
  string output;
  string cmd;
  value_type *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffebf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  string local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  string local_f8 [32];
  long local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  byte local_99;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_80 [48];
  string local_50 [8];
  string *in_stack_ffffffffffffffb8;
  string local_30 [32];
  value_type *local_10;
  string *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffebf,
                          CONCAT16(in_stack_fffffffffffffebe,in_stack_fffffffffffffeb8)),
                 (char *)in_stack_fffffffffffffeb0);
  std::__cxx11::string::~string(local_50);
  system_get_output(in_stack_ffffffffffffffb8);
  lVar2 = std::__cxx11::string::find((char *)local_80,0x142448);
  if (((lVar2 == -1) && (lVar2 = std::__cxx11::string::find((char *)local_80,0x142458), lVar2 == -1)
      ) && (lVar2 = std::__cxx11::string::size(), lVar2 != 0)) {
    this = &local_98;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x10bbcc);
    tokenize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    local_99 = 0;
    local_a8 = &local_98;
    local_b0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffea8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffea8);
    do {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffeb0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffea8);
      if (!bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(this);
        std::__cxx11::string::~string(local_80);
        std::__cxx11::string::~string(local_30);
        return;
      }
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_b0);
      __lhs = collectDependencies::anon_class_8_1_898e5cf2::operator()
                        ((anon_class_8_1_898e5cf2 *)in_stack_fffffffffffffeb0,
                         (char *)in_stack_fffffffffffffea8);
      if (((bool)__lhs) ||
         (bVar1 = collectDependencies::anon_class_8_1_898e5cf2::operator()
                            ((anon_class_8_1_898e5cf2 *)in_stack_fffffffffffffeb0,
                             (char *)in_stack_fffffffffffffea8), bVar1)) {
        if ((local_99 & 1) != 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "\n\n/!\\ ERROR: Failed to find name before next cmd");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          exit(1);
        }
        local_99 = 1;
      }
      else if (((local_99 & 1) != 0) &&
              (local_d8 = std::__cxx11::string::find((char *)pbVar4,0x1424ea), local_d8 != -1)) {
        in_stack_fffffffffffffea8 = local_10;
        std::__cxx11::string::substr((ulong)local_118,(ulong)pbVar4);
        std::operator+(__lhs,in_stack_fffffffffffffeb0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        std::__cxx11::string::~string(local_f8);
        std::__cxx11::string::~string(local_118);
        local_99 = 0;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_b0);
    } while( true );
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot find file ");
  poVar3 = std::operator<<(poVar3,local_8);
  poVar3 = std::operator<<(poVar3," to read its dependencies");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void collectDependencies(const std::string& filename, std::vector<std::string>& lines)
{
    // execute "otool -l" on the given file and collect the command's output
    std::string cmd = "otool -l \"" + filename + "\"";
    std::string output = system_get_output(cmd);

    if(output.find("can't open file")!=std::string::npos or output.find("No such file")!=std::string::npos or output.size()<1)
    {
        std::cerr << "Cannot find file " << filename << " to read its dependencies" << std::endl;
        exit(1);
    }
    
    // split output
    std::vector<std::string> raw_lines;
    tokenize(output, "\n", &raw_lines);

    bool searching = false;
    for(const auto& line : raw_lines) {
        const auto &is_prefix = [&line](const char *const p) { return line.find(p) != std::string::npos; };
        if (is_prefix("cmd LC_LOAD_DYLIB") || is_prefix("cmd LC_REEXPORT_DYLIB"))
        {
            if (searching)
            {
                std::cerr << "\n\n/!\\ ERROR: Failed to find name before next cmd" << std::endl;
                exit(1);
            }
            searching = true;
        }
        else if (searching)
        {
            size_t found = line.find("name ");
            if (found != std::string::npos)
            {
                lines.push_back('\t' + line.substr(found+5, std::string::npos));
                searching = false;
            }
        }
    }
}